

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O2

void ORPG::Core::permute_args(int start,int end,int opt_end,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  
  uVar3 = ORPG::Utils::gcd(end - start,opt_end - end);
  iVar4 = (opt_end - start) / (int)uVar3;
  uVar6 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    uVar1 = uVar6 + (long)end;
    uVar8 = uVar1 & 0xffffffff;
    iVar7 = iVar4;
    while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
      iVar9 = opt_end - end;
      if (end <= (int)uVar8) {
        iVar9 = -(end - start);
      }
      uVar3 = (int)uVar8 + iVar9;
      uVar8 = (ulong)uVar3;
      pcVar2 = argv[(int)uVar3];
      argv[(int)uVar3] = argv[uVar1];
      argv[uVar1] = pcVar2;
    }
  }
  return;
}

Assistant:

static void permute_args(int start,
                                int end,
                                int opt_end,
                                char* argv[])
        {
            int cycle_start, cycle_len, cycle, nonopts, nopts, pos;
            char *swap;

            /* compute lengths of array blocks, number, size of cycles */
            nonopts = end - start;
            nopts = opt_end - end;
            cycle = ORPG::Utils::gcd(nonopts, nopts);
            cycle_len = (opt_end - start) / cycle;

            for (int i = 0; i < cycle; i++) {
                cycle_start = end + i;
                pos = cycle_start;

                for (int j = 0; j < cycle_len; j++) {
                    if (pos >= end) pos -= nonopts;
                    else            pos += nopts;

                    swap = argv[pos];
                    /* linted const cast */
                    ((char **)argv)[pos] = argv[cycle_start];

                    /* linted const cast */
                    ((char **)argv)[cycle_start] = swap;
                }
            }
        }